

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

bool __thiscall EOPlus::Lexer::GetCharIf(Lexer *this,char *c,function<bool_(char)> *f)

{
  bool bVar1;
  char cc;
  char local_19;
  
  local_19 = '\0';
  bVar1 = PeekChar(this,&local_19);
  if (bVar1) {
    bVar1 = std::function<bool_(char)>::operator()(f,local_19);
    if (bVar1) {
      bVar1 = GetChar(this,c);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Lexer::GetCharIf(char& c, std::function<bool(char)> f)
	{
		char cc = '\0';

		if (!this->PeekChar(cc) || !f(cc))
			return false;

		return this->GetChar(c);
	}